

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall
capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Builder::adoptWithCaveats
          (Builder *this,uint index,Orphan<capnp::compiler::Token> *orphan)

{
  StructBuilder other;
  OrphanBuilder *this_00;
  uint uVar1;
  uint index_00;
  StructSize local_74;
  StructBuilder local_70;
  StructBuilder local_48;
  OrphanBuilder *local_20;
  Orphan<capnp::compiler::Token> *orphan_local;
  Builder *pBStack_10;
  uint index_local;
  Builder *this_local;
  
  local_20 = &orphan->builder;
  orphan_local._4_4_ = index;
  pBStack_10 = this;
  uVar1 = size(this);
  if (index < uVar1) {
    index_00 = bounded<unsigned_int>(orphan_local._4_4_);
    capnp::_::ListBuilder::getStructElement(&local_48,&this->builder,index_00);
    this_00 = local_20;
    capnp::_::StructSize::StructSize(&local_74,0,0);
    capnp::_::OrphanBuilder::asStruct(&local_70,this_00,local_74);
    other.capTable = local_70.capTable;
    other.segment = local_70.segment;
    other.data = local_70.data;
    other.pointers = local_70.pointers;
    other.dataSize = local_70.dataSize;
    other.pointerCount = local_70.pointerCount;
    other._38_2_ = local_70._38_2_;
    capnp::_::StructBuilder::transferContentFrom(&local_48,other);
    return;
  }
  kj::_::inlineRequireFailure
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/list.h"
             ,0x108,"index < size()","",(char *)0x0);
}

Assistant:

inline void adoptWithCaveats(uint index, Orphan<T>&& orphan) {
      // Mostly behaves like you'd expect `adopt` to behave, but with two caveats originating from
      // the fact that structs in a struct list are allocated inline rather than by pointer:
      // * This actually performs a shallow copy, effectively adopting each of the orphan's
      //   children rather than adopting the orphan itself.  The orphan ends up being discarded,
      //   possibly wasting space in the message object.
      // * If the orphan is larger than the target struct -- say, because the orphan was built
      //   using a newer version of the schema that has additional fields -- it will be truncated,
      //   losing data.

      KJ_IREQUIRE(index < size());

      // We pass a zero-valued StructSize to asStruct() because we do not want the struct to be
      // expanded under any circumstances.  We're just going to throw it away anyway, and
      // transferContentFrom() already carefully compares the struct sizes before transferring.
      builder.getStructElement(bounded(index) * ELEMENTS).transferContentFrom(
          orphan.builder.asStruct(_::StructSize(ZERO * WORDS, ZERO * POINTERS)));
    }